

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  long *plVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  int *piVar7;
  int *piVar8;
  long *plVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  BYTE *pBVar16;
  long *plVar17;
  int iVar18;
  ulong uVar19;
  char *pcVar20;
  BYTE *e_1;
  BYTE *pBVar21;
  long lVar22;
  BYTE *pBVar23;
  LZ4_stream_t_internal *streamPtr;
  char *pcVar24;
  long *plVar25;
  ulong uVar26;
  char *pcVar27;
  BYTE *s;
  uint uVar28;
  BYTE *e;
  long *plVar29;
  BYTE *s_3;
  BYTE *pBVar30;
  ulong uVar31;
  long *plVar32;
  BYTE *s_2;
  long *plVar33;
  U32 *hashTable;
  char *local_c0;
  char *local_b0;
  int local_70;
  
  if (*(int *)((long)LZ4_stream->table + 0x4004) != 0) {
    return 0;
  }
  uVar28 = (uint)LZ4_stream->table[0x803];
  pBVar30 = (BYTE *)((ulong)uVar28 + LZ4_stream->table[0x801]);
  pBVar23 = (BYTE *)source;
  if (pBVar30 < source) {
    pBVar23 = pBVar30;
  }
  if (uVar28 == 0) {
    pBVar23 = (BYTE *)source;
  }
  LZ4_renormDictT((LZ4_stream_t_internal *)LZ4_stream,pBVar23);
  uVar28 = 1;
  if (1 < acceleration) {
    uVar28 = acceleration;
  }
  pBVar16 = (BYTE *)(source + inputSize);
  pBVar23 = (BYTE *)LZ4_stream->table[0x801];
  if (pBVar16 < pBVar30 && pBVar23 < pBVar16) {
    local_70 = (int)pBVar16;
    uVar5 = (int)pBVar30 - local_70;
    uVar6 = 0x10000;
    if (uVar5 < 0x10000) {
      uVar6 = uVar5;
    }
    uVar31 = 0;
    if (3 < uVar5) {
      uVar31 = (ulong)uVar6;
    }
    *(int *)(LZ4_stream->table + 0x803) = (int)uVar31;
    pBVar23 = pBVar30 + -uVar31;
    LZ4_stream->table[0x801] = (longlong)pBVar23;
  }
  uVar6 = (uint)LZ4_stream->table[0x803];
  uVar31 = (ulong)uVar6;
  iVar11 = (int)dest;
  if (pBVar30 != (BYTE *)source) {
    if (uVar6 < 0x10000) {
      uVar5 = (uint)LZ4_stream->table[0x800];
      uVar19 = (ulong)uVar5;
      if (uVar5 <= uVar6) goto LAB_00153b08;
      iVar18 = 0;
      if ((uint)inputSize < 0x7e000001) {
        pcVar27 = dest;
        plVar33 = (long *)source;
        if ((0xc < (uint)inputSize) &&
           (*(uint *)((long)LZ4_stream->table +
                     (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
                 uVar5, inputSize != 0xd)) {
          plVar1 = (long *)(pBVar16 + -0xc);
          plVar9 = (long *)(pBVar16 + -5);
          lVar22 = (long)source - uVar19;
          plVar25 = (long *)(source + 2);
LAB_00154a9c:
          lVar14 = *(long *)((long)plVar33 + 1);
          plVar29 = (long *)((long)plVar33 + 1);
          uVar6 = uVar28 & 0x3ffffff;
          uVar5 = uVar28 * 0x40;
          do {
            plVar17 = plVar25;
            uVar5 = uVar5 + 1;
            uVar13 = (ulong)uVar6;
            uVar26 = (ulong)((uint)((ulong)(lVar14 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            uVar10 = (ulong)*(uint *)((long)LZ4_stream->table + uVar26 * 4);
            pcVar24 = (char *)(uVar10 + lVar22);
            lVar14 = *plVar17;
            iVar18 = (int)lVar22;
            *(int *)((long)LZ4_stream->table + uVar26 * 4) = (int)plVar29 - iVar18;
            if ((source + -uVar31 <= pcVar24) && (plVar29 <= (long *)(uVar10 + lVar22 + 0xffff))) {
              pBVar30 = (BYTE *)0x0;
              if (pcVar24 < source) {
                pBVar30 = pBVar23 + (uVar31 - (long)source);
              }
              if (*(int *)(pcVar24 + (long)pBVar30) == (int)*plVar29) goto LAB_00154b33;
            }
            uVar6 = uVar5 >> 6;
            plVar25 = (long *)(uVar13 + (long)plVar17);
            plVar29 = plVar17;
            if (plVar1 < (long *)(uVar13 + (long)plVar17)) break;
          } while( true );
        }
LAB_00153a5d:
        uVar31 = (long)pBVar16 - (long)plVar33;
        iVar18 = 0;
        if (pcVar27 + (uVar31 + 0xf0) / 0xff + (uVar31 - (long)dest) + 1 <=
            (char *)(ulong)(uint)maxOutputSize) {
          if (uVar31 < 0xf) {
            *pcVar27 = (char)uVar31 << 4;
          }
          else {
            uVar19 = uVar31 - 0xf;
            *pcVar27 = -0x10;
            pcVar24 = pcVar27 + 1;
            if (0xfe < uVar19) {
              uVar19 = (uVar31 - 0x10e) / 0xff;
              memset(pcVar24,0xff,uVar19 + 1);
              pcVar24 = pcVar27 + uVar19 + 2;
              uVar19 = (uVar31 + uVar19 * -0xff) - 0x10e;
            }
            *pcVar24 = (char)uVar19;
            pcVar27 = pcVar24;
          }
          memcpy(pcVar27 + 1,plVar33,uVar31);
          iVar18 = ((int)(pcVar27 + 1) + (int)uVar31) - iVar11;
        }
      }
    }
    else {
LAB_00153b08:
      iVar18 = 0;
      if ((uint)inputSize < 0x7e000001) {
        pcVar27 = dest;
        plVar33 = (long *)source;
        if (0xc < (uint)inputSize) {
          uVar6 = (uint)LZ4_stream->table[0x800];
          uVar19 = (ulong)uVar6;
          *(uint *)((long)LZ4_stream->table +
                   (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
               uVar6;
          if (inputSize != 0xd) {
            plVar1 = (long *)(pBVar16 + -0xc);
            plVar9 = (long *)(pBVar16 + -5);
            lVar22 = (long)source - uVar19;
            plVar25 = (long *)(source + 2);
LAB_00154190:
            lVar14 = *(long *)((long)plVar33 + 1);
            plVar29 = (long *)((long)plVar33 + 1);
            uVar5 = uVar28 & 0x3ffffff;
            uVar6 = uVar28 * 0x40;
            do {
              plVar17 = plVar25;
              uVar6 = uVar6 + 1;
              uVar13 = (ulong)uVar5;
              uVar26 = (ulong)((uint)((ulong)(lVar14 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
              uVar10 = (ulong)*(uint *)((long)LZ4_stream->table + uVar26 * 4);
              lVar14 = *plVar17;
              iVar18 = (int)lVar22;
              *(int *)((long)LZ4_stream->table + uVar26 * 4) = (int)plVar29 - iVar18;
              if (plVar29 <= (long *)(lVar22 + uVar10 + 0xffff)) {
                pcVar24 = (char *)(lVar22 + uVar10);
                pBVar30 = (BYTE *)0x0;
                if (pcVar24 < source) {
                  pBVar30 = pBVar23 + (uVar31 - (long)source);
                }
                if (*(int *)(pcVar24 + (long)pBVar30) == (int)*plVar29) goto LAB_00154214;
              }
              uVar5 = uVar6 >> 6;
              plVar25 = (long *)(uVar13 + (long)plVar17);
              plVar29 = plVar17;
              if (plVar1 < (long *)(uVar13 + (long)plVar17)) break;
            } while( true );
          }
        }
LAB_00153b2a:
        uVar31 = (long)pBVar16 - (long)plVar33;
        iVar18 = 0;
        if (pcVar27 + (uVar31 + 0xf0) / 0xff + (uVar31 - (long)dest) + 1 <=
            (char *)(ulong)(uint)maxOutputSize) {
          if (uVar31 < 0xf) {
            *pcVar27 = (char)uVar31 << 4;
          }
          else {
            uVar19 = uVar31 - 0xf;
            *pcVar27 = -0x10;
            pcVar24 = pcVar27 + 1;
            if (0xfe < uVar19) {
              uVar19 = (uVar31 - 0x10e) / 0xff;
              memset(pcVar24,0xff,uVar19 + 1);
              pcVar24 = pcVar27 + uVar19 + 2;
              uVar19 = (uVar31 + uVar19 * -0xff) - 0x10e;
            }
            *pcVar24 = (char)uVar19;
            pcVar27 = pcVar24;
          }
          memcpy(pcVar27 + 1,plVar33,uVar31);
          iVar18 = ((int)(pcVar27 + 1) + (int)uVar31) - iVar11;
        }
      }
    }
LAB_00154f02:
    LZ4_stream->table[0x801] = (longlong)source;
    iVar11 = inputSize;
    goto LAB_00154f0f;
  }
  pcVar27 = dest;
  plVar33 = (long *)source;
  if (uVar6 < 0x10000) {
    uVar5 = (uint)LZ4_stream->table[0x800];
    if (uVar5 <= uVar6) goto LAB_00153ffc;
    iVar18 = 0;
    if (0x7e000000 < (uint)inputSize) goto LAB_001549c3;
    if ((0xc < (uint)inputSize) &&
       (*(uint *)((long)LZ4_stream->table +
                 (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) =
             uVar5, inputSize != 0xd)) {
      piVar7 = (int *)(source + -uVar31);
      plVar1 = (long *)(pBVar16 + -0xc);
      pcVar24 = dest + maxOutputSize;
      lVar22 = (long)source - (ulong)uVar5;
      plVar25 = (long *)(source + 2);
      do {
        lVar14 = *(long *)((long)plVar33 + 1);
        plVar9 = (long *)((long)plVar33 + 1);
        uVar6 = uVar28 & 0x3ffffff;
        uVar15 = uVar28 * 0x40;
        while( true ) {
          plVar29 = plVar25;
          uVar15 = uVar15 + 1;
          uVar19 = (ulong)uVar6;
          uVar10 = (ulong)((uint)((ulong)(lVar14 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
          uVar31 = (ulong)*(uint *)((long)LZ4_stream->table + uVar10 * 4);
          piVar8 = (int *)(uVar31 + lVar22);
          lVar14 = *plVar29;
          iVar18 = (int)lVar22;
          *(int *)((long)LZ4_stream->table + uVar10 * 4) = (int)plVar9 - iVar18;
          if (((piVar7 <= piVar8) && (plVar9 <= (long *)(uVar31 + lVar22 + 0xffff))) &&
             (*piVar8 == (int)*plVar9)) break;
          uVar6 = uVar15 >> 6;
          plVar25 = (long *)(uVar19 + (long)plVar29);
          plVar9 = plVar29;
          if (plVar1 < (long *)(uVar19 + (long)plVar29)) goto LAB_0015401f;
        }
        if ((plVar33 < plVar9) && (piVar7 < piVar8)) {
          lVar14 = uVar31 - uVar5;
          lVar12 = 0;
          do {
            lVar2 = lVar12;
            if ((*(char *)((long)plVar9 + lVar12 + -1) != source[lVar12 + lVar14 + -1]) ||
               (lVar2 = lVar12 + -1, (long *)((long)plVar9 + lVar12 + -1) <= plVar33)) break;
            lVar4 = lVar12 + lVar14;
            lVar12 = lVar2;
          } while (piVar7 < source + lVar4 + -1);
          plVar9 = (long *)((long)plVar9 + lVar2);
          piVar8 = (int *)(source + lVar2 + lVar14);
        }
        uVar31 = (long)plVar9 - (long)plVar33;
        uVar19 = uVar31 & 0xffffffff;
        if (pcVar24 < pcVar27 + uVar19 / 0xff + uVar19 + 9) goto LAB_00154f5a;
        plVar25 = (long *)(pcVar27 + 1);
        if ((uint)uVar31 < 0xf) {
          *pcVar27 = (char)uVar31 << 4;
        }
        else {
          uVar6 = (uint)uVar31 - 0xf;
          *pcVar27 = -0x10;
          if (0xfe < (int)uVar6) {
            if (0x1fc < uVar6) {
              uVar6 = 0x1fd;
            }
            uVar31 = (ulong)(((int)plVar9 - (uVar6 + (int)plVar33)) + 0xef) / 0xff;
            memset(plVar25,0xff,uVar31 + 1);
            plVar25 = (long *)(pcVar27 + uVar31 + 2);
            uVar6 = (((int)plVar9 - (int)plVar33) + (int)uVar31 * -0xff) - 0x10e;
          }
          *(char *)plVar25 = (char)uVar6;
          plVar25 = (long *)((long)plVar25 + 1);
        }
        plVar29 = (long *)(uVar19 + (long)plVar25);
        do {
          *plVar25 = *plVar33;
          plVar25 = plVar25 + 1;
          plVar33 = plVar33 + 1;
        } while (plVar25 < plVar29);
        *(short *)plVar29 = (short)plVar9 - (short)piVar8;
        uVar6 = LZ4_count((BYTE *)((long)plVar9 + 4),(BYTE *)(piVar8 + 1),pBVar16 + -5);
        if (pcVar24 < (char *)((long)plVar29 + (ulong)(uVar6 >> 8) + 8)) goto LAB_00154f43;
        plVar33 = (long *)((long)plVar9 + (ulong)(uVar6 + 4));
        pcVar20 = pcVar27;
        while( true ) {
          pcVar27 = (char *)((long)plVar29 + 2);
          if (uVar6 < 0xf) {
            *pcVar20 = *pcVar20 + (char)uVar6;
          }
          else {
            *pcVar20 = *pcVar20 + '\x0f';
            uVar15 = uVar6 - 0xf;
            if (0x1fd < uVar15) {
              uVar3 = ((uVar6 - 0x20d) / 0x1fe) * 2;
              memset(pcVar27,0xff,(ulong)uVar3 + 2);
              uVar15 = (uVar3 + ((uVar6 - 0x20d) / 0x1fe) * -0x200 + uVar6) - 0x20d;
              pcVar27 = (char *)((long)plVar29 + (ulong)uVar3 + 4);
            }
            if (0xfe < uVar15) {
              uVar15 = uVar15 - 0xff;
              *pcVar27 = -1;
              pcVar27 = pcVar27 + 1;
            }
            *pcVar27 = (char)uVar15;
            pcVar27 = pcVar27 + 1;
          }
          if (plVar1 < plVar33) goto LAB_0015401f;
          *(int *)((long)LZ4_stream->table +
                  (ulong)((uint)((ulong)(*(long *)((long)plVar33 + -2) * 0xcf1bbcdcbb) >> 0x1c) &
                         0xfff) * 4) = ((int)plVar33 + -2) - iVar18;
          uVar19 = (ulong)((uint)((ulong)(*plVar33 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
          uVar31 = (ulong)*(uint *)((long)LZ4_stream->table + uVar19 * 4);
          piVar8 = (int *)(uVar31 + lVar22);
          *(int *)((long)LZ4_stream->table + uVar19 * 4) = (int)plVar33 - iVar18;
          if (((piVar8 < piVar7) || ((long *)(uVar31 + lVar22 + 0xffff) < plVar33)) ||
             (*piVar8 != (int)*plVar33)) break;
          plVar29 = (long *)(pcVar27 + 1);
          *pcVar27 = '\0';
          *(short *)(pcVar27 + 1) = (short)plVar33 - (short)piVar8;
          uVar6 = LZ4_count((BYTE *)((long)plVar33 + 4),(BYTE *)(piVar8 + 1),pBVar16 + -5);
          plVar33 = (long *)((long)plVar33 + (ulong)(uVar6 + 4));
          pcVar20 = pcVar27;
          if (pcVar24 < pcVar27 + (ulong)(uVar6 >> 8) + 9) goto LAB_00154f43;
        }
        plVar25 = (long *)((long)plVar33 + 2);
      } while (plVar25 <= plVar1);
    }
  }
  else {
LAB_00153ffc:
    iVar18 = 0;
    if (0x7e000000 < (uint)inputSize) goto LAB_001549c3;
    if (0xc < (uint)inputSize) {
      uVar6 = (uint)LZ4_stream->table[0x800];
      *(uint *)((long)LZ4_stream->table +
               (ulong)((uint)((ulong)(*(long *)source * 0xcf1bbcdcbb) >> 0x1c) & 0xfff) * 4) = uVar6
      ;
      if (inputSize != 0xd) {
        plVar1 = (long *)(pBVar16 + -0xc);
        pcVar24 = dest + maxOutputSize;
        lVar22 = (long)source - (ulong)uVar6;
        plVar25 = (long *)(source + 2);
        do {
          lVar14 = *(long *)((long)plVar33 + 1);
          plVar9 = (long *)((long)plVar33 + 1);
          uVar5 = uVar28 & 0x3ffffff;
          uVar15 = uVar28 * 0x40;
          while( true ) {
            plVar29 = plVar25;
            uVar15 = uVar15 + 1;
            uVar10 = (ulong)uVar5;
            uVar13 = (ulong)((uint)((ulong)(lVar14 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            uVar19 = (ulong)*(uint *)((long)LZ4_stream->table + uVar13 * 4);
            lVar14 = *plVar29;
            iVar18 = (int)lVar22;
            *(int *)((long)LZ4_stream->table + uVar13 * 4) = (int)plVar9 - iVar18;
            if ((plVar9 <= (long *)(lVar22 + uVar19 + 0xffff)) &&
               (piVar7 = (int *)(lVar22 + uVar19), *piVar7 == (int)*plVar9)) break;
            uVar5 = uVar15 >> 6;
            plVar25 = (long *)(uVar10 + (long)plVar29);
            plVar9 = plVar29;
            if (plVar1 < (long *)(uVar10 + (long)plVar29)) goto LAB_0015401f;
          }
          if ((plVar33 < plVar9) && (source + -uVar31 < piVar7)) {
            lVar14 = uVar19 - uVar6;
            lVar12 = 0;
            do {
              lVar2 = lVar12;
              if ((*(char *)((long)plVar9 + lVar12 + -1) != source[lVar12 + lVar14 + -1]) ||
                 (lVar2 = lVar12 + -1, (long *)((long)plVar9 + lVar12 + -1) <= plVar33)) break;
              lVar4 = lVar12 + lVar14;
              lVar12 = lVar2;
            } while (source + -uVar31 < source + lVar4 + -1);
            plVar9 = (long *)((long)plVar9 + lVar2);
            piVar7 = (int *)(source + lVar2 + lVar14);
          }
          uVar19 = (long)plVar9 - (long)plVar33;
          uVar10 = uVar19 & 0xffffffff;
          if (pcVar24 < pcVar27 + uVar10 / 0xff + uVar10 + 9) goto LAB_00154f5a;
          plVar25 = (long *)(pcVar27 + 1);
          if ((uint)uVar19 < 0xf) {
            *pcVar27 = (char)uVar19 << 4;
          }
          else {
            uVar5 = (uint)uVar19 - 0xf;
            *pcVar27 = -0x10;
            if (0xfe < (int)uVar5) {
              if (0x1fc < uVar5) {
                uVar5 = 0x1fd;
              }
              uVar5 = ((int)plVar9 - (uVar5 + (int)plVar33)) + 0xef;
              uVar19 = (ulong)uVar5 / 0xff;
              memset(plVar25,0xff,uVar19 + 1);
              plVar25 = (long *)(pcVar27 + uVar19 + 2);
              uVar5 = (((int)plVar9 - (int)plVar33) + uVar5 / 0xff) - 0x10e;
            }
            *(char *)plVar25 = (char)uVar5;
            plVar25 = (long *)((long)plVar25 + 1);
          }
          plVar29 = (long *)(uVar10 + (long)plVar25);
          do {
            *plVar25 = *plVar33;
            plVar25 = plVar25 + 1;
            plVar33 = plVar33 + 1;
          } while (plVar25 < plVar29);
          *(short *)plVar29 = (short)plVar9 - (short)piVar7;
          uVar5 = LZ4_count((BYTE *)((long)plVar9 + 4),(BYTE *)(piVar7 + 1),pBVar16 + -5);
          if (pcVar24 < (char *)((long)plVar29 + (ulong)(uVar5 >> 8) + 8)) goto LAB_00154f43;
          plVar33 = (long *)((long)plVar9 + (ulong)(uVar5 + 4));
          pcVar20 = pcVar27;
          while( true ) {
            pcVar27 = (char *)((long)plVar29 + 2);
            if (uVar5 < 0xf) {
              *pcVar20 = *pcVar20 + (char)uVar5;
            }
            else {
              *pcVar20 = *pcVar20 + '\x0f';
              uVar15 = uVar5 - 0xf;
              if (0x1fd < uVar15) {
                uVar3 = ((uVar5 - 0x20d) / 0x1fe) * 2;
                memset(pcVar27,0xff,(ulong)uVar3 + 2);
                uVar15 = (uVar3 + ((uVar5 - 0x20d) / 0x1fe) * -0x200 + uVar5) - 0x20d;
                pcVar27 = (char *)((ulong)uVar3 + 4 + (long)plVar29);
              }
              if (0xfe < uVar15) {
                uVar15 = uVar15 - 0xff;
                *pcVar27 = -1;
                pcVar27 = pcVar27 + 1;
              }
              *pcVar27 = (char)uVar15;
              pcVar27 = pcVar27 + 1;
            }
            if (plVar1 < plVar33) goto LAB_0015401f;
            *(int *)((long)LZ4_stream->table +
                    (ulong)((uint)((ulong)(*(long *)((long)plVar33 + -2) * 0xcf1bbcdcbb) >> 0x1c) &
                           0xfff) * 4) = ((int)plVar33 + -2) - iVar18;
            uVar19 = (ulong)((uint)((ulong)(*plVar33 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
            uVar10 = (ulong)*(uint *)((long)LZ4_stream->table + uVar19 * 4);
            *(int *)((long)LZ4_stream->table + uVar19 * 4) = (int)plVar33 - iVar18;
            if (((long *)(lVar22 + uVar10 + 0xffff) < plVar33) ||
               (piVar7 = (int *)(uVar10 + lVar22), *piVar7 != (int)*plVar33)) break;
            plVar29 = (long *)(pcVar27 + 1);
            *pcVar27 = '\0';
            *(short *)(pcVar27 + 1) = (short)plVar33 - (short)piVar7;
            uVar5 = LZ4_count((BYTE *)((long)plVar33 + 4),(BYTE *)(piVar7 + 1),pBVar16 + -5);
            plVar33 = (long *)((long)plVar33 + (ulong)(uVar5 + 4));
            pcVar20 = pcVar27;
            if (pcVar24 < pcVar27 + (ulong)(uVar5 >> 8) + 9) goto LAB_00154f43;
          }
          plVar25 = (long *)((long)plVar33 + 2);
        } while (plVar25 <= plVar1);
      }
    }
  }
LAB_0015401f:
  uVar31 = (long)pBVar16 - (long)plVar33;
  iVar18 = 0;
  if (pcVar27 + (uVar31 + 0xf0) / 0xff + (uVar31 - (long)dest) + 1 <=
      (char *)(ulong)(uint)maxOutputSize) {
    if (uVar31 < 0xf) {
      *pcVar27 = (char)uVar31 << 4;
    }
    else {
      uVar19 = uVar31 - 0xf;
      *pcVar27 = -0x10;
      pcVar24 = pcVar27 + 1;
      if (0xfe < uVar19) {
        uVar10 = (uVar31 - 0x10e) / 0xff;
        memset(pcVar27 + 1,0xff,uVar10 + 1);
        uVar19 = (uVar31 + uVar10 * -0xff) - 0x10e;
        pcVar24 = pcVar27 + uVar10 + 2;
      }
      pcVar27 = pcVar24;
      *pcVar27 = (char)uVar19;
    }
    memcpy(pcVar27 + 1,plVar33,uVar31);
    iVar18 = ((int)(pcVar27 + 1) + (int)uVar31) - iVar11;
  }
LAB_001549c3:
  iVar11 = (int)LZ4_stream->table[0x803] + inputSize;
LAB_00154f0f:
  *(int *)(LZ4_stream->table + 0x803) = iVar11;
  *(int *)(LZ4_stream->table + 0x800) = (int)LZ4_stream->table[0x800] + inputSize;
  return iVar18;
LAB_00154f5a:
  iVar18 = 0;
  goto LAB_001549c3;
LAB_00154f43:
  iVar18 = 0;
  goto LAB_001549c3;
LAB_00154b33:
  pBVar21 = (BYTE *)source;
  if (pcVar24 < source) {
    pBVar21 = pBVar23;
  }
  if ((plVar33 < plVar29) && (pBVar21 < pcVar24 + (long)pBVar30)) {
    lVar14 = 0;
    do {
      if (*(char *)((long)plVar29 + lVar14 + -1) !=
          source[(long)(pBVar30 + lVar14 + ~uVar19 + uVar10)]) {
        lVar12 = lVar14 + (uVar10 - uVar19);
        goto LAB_00154ba7;
      }
      lVar2 = lVar14 + -1;
    } while ((plVar33 < (long *)((long)plVar29 + lVar14 + -1)) &&
            (lVar12 = lVar14 + ~uVar19 + uVar10, lVar14 = lVar2,
            pBVar21 < source + (long)(pBVar30 + lVar12)));
    lVar12 = lVar2 + (uVar10 - uVar19);
    lVar14 = lVar2;
LAB_00154ba7:
    pcVar24 = source + lVar12;
    plVar29 = (long *)((long)plVar29 + lVar14);
  }
  uVar10 = (long)plVar29 - (long)plVar33;
  uVar13 = uVar10 & 0xffffffff;
  if (pcVar27 + uVar13 / 0xff + uVar13 + 9 <= dest + maxOutputSize) {
    plVar25 = (long *)(pcVar27 + 1);
    if ((uint)uVar10 < 0xf) {
      *pcVar27 = (char)uVar10 << 4;
    }
    else {
      uVar6 = (uint)uVar10 - 0xf;
      *pcVar27 = -0x10;
      if (0xfe < (int)uVar6) {
        if (0x1fc < uVar6) {
          uVar6 = 0x1fd;
        }
        uVar10 = (ulong)(((int)plVar29 - (uVar6 + (int)plVar33)) + 0xef) / 0xff;
        memset(plVar25,0xff,uVar10 + 1);
        plVar25 = (long *)(pcVar27 + uVar10 + 2);
        uVar6 = (((int)plVar29 - (int)plVar33) + (int)uVar10 * -0xff) - 0x10e;
      }
      *(char *)plVar25 = (char)uVar6;
      plVar25 = (long *)((long)plVar25 + 1);
    }
    plVar17 = (long *)(uVar13 + (long)plVar25);
    plVar32 = plVar33;
    do {
      *plVar25 = *plVar32;
      plVar25 = plVar25 + 1;
      plVar32 = plVar32 + 1;
      plVar33 = plVar29;
      local_b0 = pcVar27;
    } while (plVar25 < plVar17);
    do {
      *(short *)plVar17 = (short)plVar33 - (short)pcVar24;
      if (pBVar21 == pBVar23) {
        plVar25 = (long *)(pBVar23 + (uVar31 - (long)(pcVar24 + (long)pBVar30)) + (long)plVar33);
        if (plVar9 < pBVar23 + (uVar31 - (long)(pcVar24 + (long)pBVar30)) + (long)plVar33) {
          plVar25 = plVar9;
        }
        uVar6 = LZ4_count((BYTE *)((long)plVar33 + 4),(BYTE *)(pcVar24 + (long)(pBVar30 + 4)),
                          (BYTE *)plVar25);
        plVar33 = (long *)((long)plVar33 + (ulong)(uVar6 + 4));
        if (plVar33 == plVar25) {
          uVar5 = LZ4_count((BYTE *)plVar33,(BYTE *)source,(BYTE *)plVar9);
          uVar6 = uVar6 + uVar5;
          goto LAB_00154ccb;
        }
      }
      else {
        uVar6 = LZ4_count((BYTE *)((long)plVar33 + 4),(BYTE *)(pcVar24 + 4),(BYTE *)plVar9);
        uVar5 = uVar6 + 4;
LAB_00154ccb:
        plVar33 = (long *)((long)plVar33 + (ulong)uVar5);
      }
      if (dest + maxOutputSize < (char *)((long)plVar17 + (ulong)(uVar6 >> 8) + 8)) {
        iVar18 = 0;
        goto LAB_00154f02;
      }
      pcVar27 = (char *)((long)plVar17 + 2);
      if (uVar6 < 0xf) {
        *local_b0 = *local_b0 + (char)uVar6;
      }
      else {
        *local_b0 = *local_b0 + '\x0f';
        uVar5 = uVar6 - 0xf;
        if (0x1fd < uVar5) {
          uVar15 = ((uVar6 - 0x20d) / 0x1fe) * 2;
          memset(pcVar27,0xff,(ulong)uVar15 + 2);
          uVar5 = (uVar15 + ((uVar6 - 0x20d) / 0x1fe) * -0x200 + uVar6) - 0x20d;
          pcVar27 = (char *)((long)plVar17 + (ulong)uVar15 + 4);
        }
        if (0xfe < uVar5) {
          uVar5 = uVar5 - 0xff;
          *pcVar27 = -1;
          pcVar27 = pcVar27 + 1;
        }
        *pcVar27 = (char)uVar5;
        pcVar27 = pcVar27 + 1;
      }
      if (plVar1 < plVar33) goto LAB_00153a5d;
      *(int *)((long)LZ4_stream->table +
              (ulong)((uint)((ulong)(*(long *)((long)plVar33 + -2) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff)
              * 4) = ((int)plVar33 + -2) - iVar18;
      uVar13 = (ulong)((uint)((ulong)(*plVar33 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
      uVar10 = (ulong)*(uint *)((long)LZ4_stream->table + uVar13 * 4);
      pcVar24 = (char *)(uVar10 + lVar22);
      pBVar21 = (BYTE *)source;
      pBVar30 = (BYTE *)0x0;
      if (pcVar24 < source) {
        pBVar21 = pBVar23;
        pBVar30 = pBVar23 + (uVar31 - (long)source);
      }
      *(int *)((long)LZ4_stream->table + uVar13 * 4) = (int)plVar33 - iVar18;
      if (((pcVar24 < source + -uVar31) || ((long *)(uVar10 + lVar22 + 0xffff) < plVar33)) ||
         (*(int *)(pcVar24 + (long)pBVar30) != (int)*plVar33)) goto LAB_00154e7a;
      plVar17 = (long *)(pcVar27 + 1);
      *pcVar27 = '\0';
      local_b0 = pcVar27;
    } while( true );
  }
  goto LAB_00154f56;
LAB_00154e7a:
  plVar25 = (long *)((long)plVar33 + 2);
  if (plVar1 < plVar25) goto LAB_00153a5d;
  goto LAB_00154a9c;
LAB_00154214:
  pBVar21 = (BYTE *)source;
  if (pcVar24 < source) {
    pBVar21 = pBVar23;
  }
  if ((plVar33 < plVar29) && (pBVar21 < pcVar24 + (long)pBVar30)) {
    lVar14 = 0;
    do {
      if (*(char *)((long)plVar29 + lVar14 + -1) !=
          source[(long)(pBVar30 + lVar14 + ~uVar19 + uVar10)]) {
        lVar12 = lVar14 + (uVar10 - uVar19);
        goto LAB_00154288;
      }
      lVar2 = lVar14 + -1;
    } while ((plVar33 < (long *)((long)plVar29 + lVar14 + -1)) &&
            (lVar12 = lVar14 + ~uVar19 + uVar10, lVar14 = lVar2,
            pBVar21 < source + (long)(pBVar30 + lVar12)));
    lVar12 = lVar2 + (uVar10 - uVar19);
    lVar14 = lVar2;
LAB_00154288:
    pcVar24 = source + lVar12;
    plVar29 = (long *)((long)plVar29 + lVar14);
  }
  uVar10 = (long)plVar29 - (long)plVar33;
  uVar13 = uVar10 & 0xffffffff;
  if (pcVar27 + uVar13 / 0xff + uVar13 + 9 <= dest + maxOutputSize) {
    plVar25 = (long *)(pcVar27 + 1);
    if ((uint)uVar10 < 0xf) {
      *pcVar27 = (char)uVar10 << 4;
    }
    else {
      uVar6 = (uint)uVar10 - 0xf;
      *pcVar27 = -0x10;
      if (0xfe < (int)uVar6) {
        if (0x1fc < uVar6) {
          uVar6 = 0x1fd;
        }
        uVar10 = (ulong)(((int)plVar29 - (uVar6 + (int)plVar33)) + 0xef) / 0xff;
        memset(plVar25,0xff,uVar10 + 1);
        plVar25 = (long *)(pcVar27 + uVar10 + 2);
        uVar6 = (((int)plVar29 - (int)plVar33) + (int)uVar10 * -0xff) - 0x10e;
      }
      *(char *)plVar25 = (char)uVar6;
      plVar25 = (long *)((long)plVar25 + 1);
    }
    plVar17 = (long *)(uVar13 + (long)plVar25);
    plVar32 = plVar33;
    do {
      *plVar25 = *plVar32;
      plVar25 = plVar25 + 1;
      plVar32 = plVar32 + 1;
      plVar33 = plVar29;
      local_c0 = pcVar27;
    } while (plVar25 < plVar17);
    do {
      *(short *)plVar17 = (short)plVar33 - (short)pcVar24;
      if (pBVar21 == pBVar23) {
        plVar25 = (long *)(pBVar23 + (uVar31 - (long)(pcVar24 + (long)pBVar30)) + (long)plVar33);
        if (plVar9 < pBVar23 + (uVar31 - (long)(pcVar24 + (long)pBVar30)) + (long)plVar33) {
          plVar25 = plVar9;
        }
        uVar6 = LZ4_count((BYTE *)((long)plVar33 + 4),(BYTE *)(pcVar24 + (long)(pBVar30 + 4)),
                          (BYTE *)plVar25);
        plVar33 = (long *)((long)plVar33 + (ulong)(uVar6 + 4));
        if (plVar33 == plVar25) {
          uVar5 = LZ4_count((BYTE *)plVar33,(BYTE *)source,(BYTE *)plVar9);
          uVar6 = uVar6 + uVar5;
          goto LAB_001543ae;
        }
      }
      else {
        uVar6 = LZ4_count((BYTE *)((long)plVar33 + 4),(BYTE *)(pcVar24 + 4),(BYTE *)plVar9);
        uVar5 = uVar6 + 4;
LAB_001543ae:
        plVar33 = (long *)((long)plVar33 + (ulong)uVar5);
      }
      if (dest + maxOutputSize < (char *)((long)plVar17 + (ulong)(uVar6 >> 8) + 8)) {
        iVar18 = 0;
        goto LAB_00154f02;
      }
      pcVar27 = (char *)((long)plVar17 + 2);
      if (uVar6 < 0xf) {
        *local_c0 = *local_c0 + (char)uVar6;
      }
      else {
        *local_c0 = *local_c0 + '\x0f';
        uVar5 = uVar6 - 0xf;
        if (0x1fd < uVar5) {
          uVar15 = ((uVar6 - 0x20d) / 0x1fe) * 2;
          memset(pcVar27,0xff,(ulong)uVar15 + 2);
          uVar5 = (uVar15 + ((uVar6 - 0x20d) / 0x1fe) * -0x200 + uVar6) - 0x20d;
          pcVar27 = (char *)((long)plVar17 + (ulong)uVar15 + 4);
        }
        if (0xfe < uVar5) {
          uVar5 = uVar5 - 0xff;
          *pcVar27 = -1;
          pcVar27 = pcVar27 + 1;
        }
        *pcVar27 = (char)uVar5;
        pcVar27 = pcVar27 + 1;
      }
      if (plVar1 < plVar33) goto LAB_00153b2a;
      *(int *)((long)LZ4_stream->table +
              (ulong)((uint)((ulong)(*(long *)((long)plVar33 + -2) * 0xcf1bbcdcbb) >> 0x1c) & 0xfff)
              * 4) = ((int)plVar33 + -2) - iVar18;
      uVar10 = (ulong)((uint)((ulong)(*plVar33 * 0xcf1bbcdcbb) >> 0x1c) & 0xfff);
      uVar13 = (ulong)*(uint *)((long)LZ4_stream->table + uVar10 * 4);
      pcVar24 = (char *)(lVar22 + uVar13);
      pBVar21 = (BYTE *)source;
      pBVar30 = (BYTE *)0x0;
      if (pcVar24 < source) {
        pBVar21 = pBVar23;
        pBVar30 = pBVar23 + (uVar31 - (long)source);
      }
      *(int *)((long)LZ4_stream->table + uVar10 * 4) = (int)plVar33 - iVar18;
      if (((long *)(lVar22 + uVar13 + 0xffff) < plVar33) ||
         (*(int *)(pcVar24 + (long)pBVar30) != (int)*plVar33)) goto LAB_00154571;
      plVar17 = (long *)(pcVar27 + 1);
      *pcVar27 = '\0';
      local_c0 = pcVar27;
    } while( true );
  }
LAB_00154f56:
  iVar18 = 0;
  goto LAB_00154f02;
LAB_00154571:
  plVar25 = (long *)((long)plVar33 + 2);
  if (plVar1 < plVar25) goto LAB_00153b2a;
  goto LAB_00154190;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* streamPtr = (LZ4_stream_t_internal*)LZ4_stream;
    const BYTE* const dictEnd = streamPtr->dictionary + streamPtr->dictSize;

    const BYTE* smallest = (const BYTE*) source;
    if (streamPtr->initCheck) return 0;   /* Uninitialized structure detected */
    if ((streamPtr->dictSize>0) && (smallest>dictEnd)) smallest = dictEnd;
    LZ4_renormDictT(streamPtr, smallest);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;

    /* Check overlapping input/dictionary space */
    {
        const BYTE* sourceEnd = (const BYTE*) source + inputSize;
        if ((sourceEnd > streamPtr->dictionary) && (sourceEnd < dictEnd))
        {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == (const BYTE*)source)
    {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, withPrefix64k, noDictIssue, acceleration);
        streamPtr->dictSize += (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }

    /* external dictionary mode */
    {
        int result;
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, dictSmall, acceleration);
        else
            result = LZ4_compress_generic(LZ4_stream, source, dest, inputSize, maxOutputSize, limitedOutput, byU32, usingExtDict, noDictIssue, acceleration);
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        streamPtr->currentOffset += (U32)inputSize;
        return result;
    }
}